

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  int iVar1;
  TValue *v;
  int temp;
  expdesc *e_local;
  FuncState *fs_local;
  
  switch(e->k) {
  case VLOCAL:
    *(uint *)&e->u = (uint)(e->u).var.ridx;
    e->k = VNONRELOC;
    break;
  case VUPVAL:
    iVar1 = luaK_codeABCk(fs,OP_GETUPVAL,0,(e->u).info,0,0);
    (e->u).info = iVar1;
    e->k = VRELOC;
    break;
  case VCONST:
    v = const2val(fs,e);
    const2exp(v,e);
    break;
  case VINDEXED:
    freeregs(fs,(uint)(e->u).ind.t,(int)(e->u).ind.idx);
    iVar1 = luaK_codeABCk(fs,OP_GETTABLE,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx,0);
    (e->u).info = iVar1;
    e->k = VRELOC;
    break;
  case VINDEXUP:
    iVar1 = luaK_codeABCk(fs,OP_GETTABUP,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx,0);
    (e->u).info = iVar1;
    e->k = VRELOC;
    break;
  case VINDEXI:
    freereg(fs,(uint)(e->u).ind.t);
    iVar1 = luaK_codeABCk(fs,OP_GETI,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx,0);
    (e->u).info = iVar1;
    e->k = VRELOC;
    break;
  case VINDEXSTR:
    freereg(fs,(uint)(e->u).ind.t);
    iVar1 = luaK_codeABCk(fs,OP_GETFIELD,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx,0);
    (e->u).info = iVar1;
    e->k = VRELOC;
    break;
  default:
    break;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
  }
  return;
}

Assistant:

void luaK_dischargevars (FuncState *fs, expdesc *e) {
  switch (e->k) {
    case VCONST: {
      const2exp(const2val(fs, e), e);
      break;
    }
    case VLOCAL: {  /* already in a register */
      int temp = e->u.var.ridx;
      e->u.info = temp;  /* (can't do a direct assignment; values overlap) */
      e->k = VNONRELOC;  /* becomes a non-relocatable value */
      break;
    }
    case VUPVAL: {  /* move value to some (pending) register */
      e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
      e->k = VRELOC;
      break;
    }
    case VINDEXUP: {
      e->u.info = luaK_codeABC(fs, OP_GETTABUP, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXI: {
      freereg(fs, e->u.ind.t);
      e->u.info = luaK_codeABC(fs, OP_GETI, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXSTR: {
      freereg(fs, e->u.ind.t);
      e->u.info = luaK_codeABC(fs, OP_GETFIELD, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VINDEXED: {
      freeregs(fs, e->u.ind.t, e->u.ind.idx);
      e->u.info = luaK_codeABC(fs, OP_GETTABLE, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOC;
      break;
    }
    case VVARARG: case VCALL: {
      luaK_setoneret(fs, e);
      break;
    }
    default: break;  /* there is one value available (somewhere) */
  }
}